

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_GetSetY_Test::~Image_GetSetY_Test(Image_GetSetY_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, GetSetY) {
    Point2i res(9, 3);
    pstd::vector<float> yPixels = GetFloatPixels(res, 1);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"Y"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                image.SetChannel({x, y}, 0, yPixels[y * res[0] + x]);
            }

        ImageChannelDesc yDesc = image.GetChannelDesc({"Y"});
        EXPECT_TRUE(bool(yDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"Y0L0"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                Float v = image.GetChannel({x, y}, 0);
                ImageChannelValues cv = image.GetChannels({x, y});
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                cv = image.GetChannels({x, y}, yDesc);
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                if (format == PixelFormat::U256)
                    EXPECT_LT(std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1)),
                              0.501f / 255.f)
                        << v << " vs " << Clamp(yPixels[y * res[0] + x], 0, 1);
                else
                    EXPECT_EQ(v, modelQuantization(yPixels[y * res[0] + x], format));
            }
    }
}